

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Options::ListOptionParser::parseIntoConfig
          (ListOptionParser *this,Command *cmd,ConfigData *config)

{
  ConfigData *pCVar1;
  bool bVar2;
  size_t sVar3;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  ConfigData *local_20;
  ConfigData *config_local;
  Command *cmd_local;
  ListOptionParser *this_local;
  
  config->listSpec = TestNames;
  local_20 = config;
  config_local = (ConfigData *)cmd;
  cmd_local = (Command *)this;
  sVar3 = Command::argsCount(cmd);
  if (sVar3 != 0) {
    Command::operator[][abi_cxx11_(&local_40,(Command *)config_local,0);
    bVar2 = std::operator==(&local_40,"all");
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar2) {
      local_20->listSpec = All;
    }
    else {
      Command::operator[][abi_cxx11_(&local_70,(Command *)config_local,0);
      bVar2 = std::operator==(&local_70,"tests");
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) {
        local_20->listSpec = Tests;
      }
      else {
        Command::operator[][abi_cxx11_(&local_90,(Command *)config_local,0);
        bVar2 = std::operator==(&local_90,"reporters");
        std::__cxx11::string::~string((string *)&local_90);
        pCVar1 = config_local;
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"Expected [tests] or [reporters]",&local_b1);
          Command::raiseError((Command *)pCVar1,&local_b0);
        }
        local_20->listSpec = Reports;
      }
    }
  }
  sVar3 = Command::argsCount((Command *)config_local);
  if (1 < sVar3) {
    Command::operator[][abi_cxx11_(&local_d8,(Command *)config_local,1);
    bVar2 = std::operator==(&local_d8,"xml");
    std::__cxx11::string::~string((string *)&local_d8);
    if (bVar2) {
      local_20->listSpec = local_20->listSpec | AsXml;
    }
    else {
      Command::operator[][abi_cxx11_(&local_f8,(Command *)config_local,1);
      bVar2 = std::operator==(&local_f8,"text");
      std::__cxx11::string::~string((string *)&local_f8);
      pCVar1 = config_local;
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"Expected [xml] or [text]",&local_119);
        Command::raiseError((Command *)pCVar1,&local_118);
      }
      local_20->listSpec = local_20->listSpec | AsText;
    }
  }
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                config.listSpec = List::TestNames;
                if( cmd.argsCount() >= 1 ) {
                    if( cmd[0] == "all" )
                        config.listSpec = List::All;
                    else if( cmd[0] == "tests" )
                        config.listSpec = List::Tests;
                    else if( cmd[0] == "reporters" )
                        config.listSpec = List::Reports;
                    else
                        cmd.raiseError( "Expected [tests] or [reporters]" );
                }
                if( cmd.argsCount() >= 2 ) {
                    if( cmd[1] == "xml" )
                        config.listSpec = static_cast<List::What>( config.listSpec | List::AsXml );
                    else if( cmd[1] == "text" )
                        config.listSpec = static_cast<List::What>( config.listSpec | List::AsText );
                    else
                        cmd.raiseError( "Expected [xml] or [text]" );
                }
            }